

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void int_to_bytes_be(uchar *bytes,int value)

{
  long in_RDI;
  long in_FS_OFFSET;
  uint i;
  uchar *pValue;
  uint local_24;
  undefined1 local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    *(undefined1 *)(in_RDI + (3 - (ulong)local_24)) = local_c[local_24];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void int_to_bytes_be(unsigned char *bytes, int value)
{
	const unsigned char *pValue = (const unsigned char *)&value;
	for(unsigned i = 0; i < sizeof(int); i++)
	{
#if defined(CONF_ARCH_ENDIAN_BIG)
		bytes[i] = pValue[i];
#else
		bytes[sizeof(int) - i - 1] = pValue[i];
#endif
	}
}